

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

size_t FNV2(char *key,int len,size_t seed)

{
  ulong uVar1;
  ulong uVar2;
  size_t h;
  ulong *puVar3;
  size_t sVar4;
  size_t *dw;
  long lVar5;
  
  uVar2 = (ulong)len;
  sVar4 = seed ^ 0xcbf29ce484222325;
  puVar3 = (ulong *)key;
  if (0 < (long)(uVar2 & 0xfffffffffffffff8)) {
    do {
      uVar1 = *puVar3;
      puVar3 = puVar3 + 1;
      sVar4 = (sVar4 ^ uVar1) * 0x100000001b3;
    } while (puVar3 < key + (uVar2 & 0xfffffffffffffff8));
  }
  if (key + uVar2 <= puVar3 || (uVar2 & 7) == 0) {
    return sVar4;
  }
  lVar5 = 0;
  do {
    sVar4 = (*(byte *)((long)puVar3 + lVar5) ^ sVar4) * 0x100000001b3;
    lVar5 = lVar5 + 1;
  } while ((long)(key + uVar2) - (long)puVar3 != lVar5);
  return sVar4;
}

Assistant:

size_t
FNV2(const char *key, int len, size_t seed)
{
  size_t h = seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
#ifdef HAVE_BIT32
  h ^= UINT32_C(2166136261);
#else
  h ^= UINT64_C(0xcbf29ce484222325);
#endif
  while (dw < endw) {
    h ^= *dw++;
#ifdef HAVE_BIT32
    h *= UINT32_C(16777619);
#else
    h *= UINT64_C(0x100000001b3);
#endif
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h ^= *dc++;
#ifdef HAVE_BIT32
      h *= UINT32_C(16777619);
#else
      h *= UINT64_C(0x100000001b3);
#endif
    }
  }
  return h;
}